

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::UnarySelectPropertyExprSyntax::setChild
          (UnarySelectPropertyExprSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004d1eac + *(int *)(&DAT_004d1eac + index * 4)))();
  return;
}

Assistant:

void UnarySelectPropertyExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: op = child.token(); return;
        case 1: openBracket = child.token(); return;
        case 2: selector = child.node() ? &child.node()->as<SelectorSyntax>() : nullptr; return;
        case 3: closeBracket = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}